

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darBalance.c
# Opt level: O0

Aig_Obj_t * Dar_BalanceBuildSuper(Aig_Man_t *p,Vec_Ptr_t *vSuper,Aig_Type_t Type,int fUpdateLevel)

{
  Aig_Obj_t *pAVar1;
  Aig_Obj_t *p1;
  int local_38;
  int LeftBound;
  Aig_Obj_t *pObj2;
  Aig_Obj_t *pObj1;
  int fUpdateLevel_local;
  Aig_Type_t Type_local;
  Vec_Ptr_t *vSuper_local;
  Aig_Man_t *p_local;
  
  if (1 < vSuper->nSize) {
    Vec_PtrSort(vSuper,Aig_NodeCompareLevelsDecrease);
    while (1 < vSuper->nSize) {
      if (fUpdateLevel == 0) {
        local_38 = 0;
      }
      else {
        local_38 = Dar_BalanceFindLeft(vSuper);
      }
      Dar_BalancePermute(p,vSuper,local_38,(uint)(Type == AIG_OBJ_EXOR));
      pAVar1 = (Aig_Obj_t *)Vec_PtrPop(vSuper);
      p1 = (Aig_Obj_t *)Vec_PtrPop(vSuper);
      pAVar1 = Aig_Oper(p,pAVar1,p1,Type);
      Dar_BalancePushUniqueOrderByLevel(vSuper,pAVar1,(uint)(Type == AIG_OBJ_EXOR));
    }
    pAVar1 = (Aig_Obj_t *)Vec_PtrEntry(vSuper,0);
    return pAVar1;
  }
  __assert_fail("vSuper->nSize > 1",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dar/darBalance.c"
                ,0x193,"Aig_Obj_t *Dar_BalanceBuildSuper(Aig_Man_t *, Vec_Ptr_t *, Aig_Type_t, int)"
               );
}

Assistant:

Aig_Obj_t * Dar_BalanceBuildSuper( Aig_Man_t * p, Vec_Ptr_t * vSuper, Aig_Type_t Type, int fUpdateLevel )
{
    Aig_Obj_t * pObj1, * pObj2;
    int LeftBound;
    assert( vSuper->nSize > 1 );
    // sort the new nodes by level in the decreasing order
    Vec_PtrSort( vSuper, (int (*)(void))Aig_NodeCompareLevelsDecrease );
    // balance the nodes
    while ( vSuper->nSize > 1 )
    {
        // find the left bound on the node to be paired
        LeftBound = (!fUpdateLevel)? 0 : Dar_BalanceFindLeft( vSuper );
        // find the node that can be shared (if no such node, randomize choice)
        Dar_BalancePermute( p, vSuper, LeftBound, Type == AIG_OBJ_EXOR );
        // pull out the last two nodes
        pObj1 = (Aig_Obj_t *)Vec_PtrPop(vSuper);
        pObj2 = (Aig_Obj_t *)Vec_PtrPop(vSuper);
        Dar_BalancePushUniqueOrderByLevel( vSuper, Aig_Oper(p, pObj1, pObj2, Type), Type == AIG_OBJ_EXOR );
    }
    return (Aig_Obj_t *)Vec_PtrEntry(vSuper, 0);
}